

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gateway.cc
# Opt level: O0

void __thiscall
prometheus::Gateway::RegisterCollectable
          (Gateway *this,weak_ptr<prometheus::Collectable> *collectable,Labels *labels)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Labels *__args;
  bool bVar1;
  reference label_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [32];
  lock_guard<std::mutex> local_1e0;
  lock_guard<std::mutex> lock;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *label;
  const_iterator __end2;
  const_iterator __begin2;
  Labels *__range2;
  stringstream ss;
  ostream local_198 [376];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_20;
  Labels *labels_local;
  weak_ptr<prometheus::Collectable> *collectable_local;
  Gateway *this_local;
  
  local_20 = labels;
  labels_local = (Labels *)collectable;
  collectable_local = (weak_ptr<prometheus::Collectable> *)this;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&__range2);
  this_00 = local_20;
  if (local_20 !=
      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(local_20);
    label = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(this_00);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&label), bVar1) {
      label_00 = ::std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end2);
      detail::encodeLabel(local_198,(Label *)label_00);
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
  }
  ::std::lock_guard<std::mutex>::lock_guard(&local_1e0,&this->mutex_);
  CleanupStalePointers(&this->collectables_);
  __args = labels_local;
  ::std::__cxx11::stringstream::str();
  ::std::
  vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
  ::emplace_back<std::weak_ptr<prometheus::Collectable>const&,std::__cxx11::string>
            ((vector<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>,std::allocator<std::pair<std::weak_ptr<prometheus::Collectable>,std::__cxx11::string>>>
              *)&this->collectables_,(weak_ptr<prometheus::Collectable> *)__args,local_200);
  ::std::__cxx11::string::~string((string *)local_200);
  ::std::lock_guard<std::mutex>::~lock_guard(&local_1e0);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&__range2);
  return;
}

Assistant:

void Gateway::RegisterCollectable(const std::weak_ptr<Collectable>& collectable,
                                  const Labels* labels) {
  std::stringstream ss;

  if (labels) {
    for (auto& label : *labels) {
      detail::encodeLabel(ss, label);
    }
  }

  std::lock_guard<std::mutex> lock{mutex_};
  CleanupStalePointers(collectables_);
  collectables_.emplace_back(collectable, ss.str());
}